

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::IdleCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   *this,SoftwareQueueIndex QueueInd,bool ReleaseResources)

{
  Uint32 UVar1;
  int iVar2;
  Char *Message;
  CommandQueue *pCVar3;
  atomic<unsigned_long> *paVar4;
  ICommandQueueVk *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  lock_guard<std::mutex> local_98;
  lock_guard<std::mutex> Lock;
  Uint64 FenceValue;
  Uint64 CmdBufferNumber;
  CommandQueue *Queue;
  undefined1 local_68 [8];
  string msg;
  bool ReleaseResources_local;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  __int_type_conflict3 _Stack_30;
  SoftwareQueueIndex QueueInd_local;
  
  msg.field_2._M_local_buf[0xf] = ReleaseResources;
  this_local._7_1_ = QueueInd.m_Value;
  UVar1 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  if (this->m_CmdQueueCount <= (ulong)UVar1) {
    FormatString<char[26],char[27]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xc108a8,
               (char (*) [27])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"IdleCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)local_68);
  }
  pCVar3 = this->m_CommandQueues;
  UVar1 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  pCVar3 = pCVar3 + UVar1;
  FenceValue = 0;
  Lock._M_device = (mutex_type *)0x0;
  std::lock_guard<std::mutex>::lock_guard(&local_98,&pCVar3->Mtx);
  if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
    paVar4 = &pCVar3->NextCmdBufferNumber;
    LOCK();
    FenceValue = (paVar4->super___atomic_base<unsigned_long>)._M_i;
    (paVar4->super___atomic_base<unsigned_long>)._M_i =
         (paVar4->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    _Stack_30 = FenceValue;
  }
  pIVar5 = RefCntAutoPtr<Diligent::ICommandQueueVk>::operator->(&pCVar3->CmdQueue);
  iVar2 = (*(pIVar5->super_ICommandQueue).super_IObject._vptr_IObject[6])();
  Lock._M_device = (mutex_type *)CONCAT44(extraout_var,iVar2);
  std::lock_guard<std::mutex>::~lock_guard(&local_98);
  if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardStaleResources
              (&pCVar3->ReleaseQueue,FenceValue,(Uint64)Lock._M_device);
    pIVar5 = RefCntAutoPtr<Diligent::ICommandQueueVk>::operator->(&pCVar3->CmdQueue);
    iVar2 = (*(pIVar5->super_ICommandQueue).super_IObject._vptr_IObject[5])();
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
              (&pCVar3->ReleaseQueue,CONCAT44(extraout_var_00,iVar2));
  }
  return;
}

Assistant:

void IdleCommandQueue(SoftwareQueueIndex QueueInd, bool ReleaseResources)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue = m_CommandQueues[QueueInd];

        Uint64 CmdBufferNumber = 0;
        Uint64 FenceValue      = 0;
        {
            std::lock_guard<std::mutex> Lock{Queue.Mtx};

            if (ReleaseResources)
            {
                // Increment the command buffer number before idling the queue.
                // This will make sure that any resource released while this function
                // is running will be associated with the next command buffer submission.
                CmdBufferNumber = Queue.NextCmdBufferNumber.fetch_add(1);
                // fetch_add returns the original value immediately preceding the addition.
            }

            FenceValue = Queue.CmdQueue->WaitForIdle();
        }

        if (ReleaseResources)
        {
            Queue.ReleaseQueue.DiscardStaleResources(CmdBufferNumber, FenceValue);
            Queue.ReleaseQueue.Purge(Queue.CmdQueue->GetCompletedFenceValue());
        }
    }